

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supplies.h
# Opt level: O0

Supplies * __thiscall KDIS::DATA_TYPE::Supplies::operator=(Supplies *this,Supplies *param_1)

{
  Supplies *param_1_local;
  Supplies *this_local;
  
  EntityType::operator=(&this->super_EntityType,&param_1->super_EntityType);
  this->m_f32Quantity = param_1->m_f32Quantity;
  return this;
}

Assistant:

class KDIS_EXPORT Supplies : public EntityType
{
protected:

    KFLOAT32 m_f32Quantity;

public:

    static const KUINT16 SUPPLIES_SIZE = 12;

    Supplies();

    Supplies( KDIS::DATA_TYPE::ENUMS::EntityKind Kind, KUINT8 Domain, KDIS::DATA_TYPE::ENUMS::Country Country, 
			  KUINT8 Categoy, KUINT8 SubCategory, KUINT8 Specific, KUINT8 Extra, KFLOAT32 Quantity );

    Supplies( EntityType Type, KFLOAT32 Quantity );

    Supplies(KDataStream &stream) noexcept(false);

    virtual ~Supplies();

    //************************************
    // FullName:    KDIS::DATA_TYPE::Supplies::SetQuantity
    //              KDIS::DATA_TYPE::Supplies::GetQuantity
    // Description: Quantity for selected supply.
    // Parameter:   KFLOAT32  F, void
    //************************************
    void SetQuantity( KFLOAT32 F );
    KFLOAT32 GetQuantity() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Supplies::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::DataTypeBase::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::Supplies::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const Supplies & Value ) const;
    KBOOL operator != ( const Supplies & Value ) const;
}